

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_optimize_for.pb.cc
# Opt level: O1

void __thiscall
proto2_unittest::TestOptionalOptimizedForSize::~TestOptionalOptimizedForSize
          (TestOptionalOptimizedForSize *this)

{
  InternalMetadata *this_00;
  TestRequiredOptimizedForSize *this_01;
  ulong uVar1;
  LogMessageFatal local_20;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
  }
  uVar1 = this_00->ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this_01 = (this->field_0)._impl_.o_;
    if (this_01 != (TestRequiredOptimizedForSize *)0x0) {
      TestRequiredOptimizedForSize::~TestRequiredOptimizedForSize(this_01);
      operator_delete(this_01,0x20);
      return;
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_optimize_for.pb.cc"
             ,0x26f,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestOptionalOptimizedForSize::~TestOptionalOptimizedForSize() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestOptionalOptimizedForSize)
  SharedDtor(*this);
}